

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O3

int handle_retire_connection_id_frame(quicly_conn_t *conn,st_quicly_handle_payload_state_t *state)

{
  uint8_t *puVar1;
  int iVar2;
  undefined8 in_RAX;
  uint64_t sequence;
  int has_pending;
  int local_14;
  
  local_14 = (int)((ulong)in_RAX >> 0x20);
  sequence = ptls_decode_quicint(&state->src,state->end);
  if (sequence == 0xffffffffffffffff) {
    iVar2 = 0x20007;
  }
  else {
    if (quicly_trace_fp != (FILE *)0x0) {
      handle_retire_connection_id_frame_cold_1();
    }
    iVar2 = 0x2000a;
    if (sequence < (byte)(conn->super).local.cid_set.plaintext.field_0x4) {
      iVar2 = quicly_local_cid_retire(&(conn->super).local.cid_set,sequence,&local_14);
      if ((iVar2 == 0) && (iVar2 = 0, local_14 != 0)) {
        puVar1 = &(conn->egress).pending_flows;
        *puVar1 = *puVar1 | 0x80;
      }
    }
  }
  return iVar2;
}

Assistant:

static int handle_retire_connection_id_frame(quicly_conn_t *conn, struct st_quicly_handle_payload_state_t *state)
{
    int ret, has_pending;
    quicly_retire_connection_id_frame_t frame;

    if ((ret = quicly_decode_retire_connection_id_frame(&state->src, state->end, &frame)) != 0)
        return ret;

    QUICLY_PROBE(RETIRE_CONNECTION_ID_RECEIVE, conn, conn->stash.now, frame.sequence);

    if (frame.sequence >= conn->super.local.cid_set.plaintext.path_id) {
        /* Receipt of a RETIRE_CONNECTION_ID frame containing a sequence number greater than any previously sent to the remote peer
         * MUST be treated as a connection error of type PROTOCOL_VIOLATION. (19.16) */
        return QUICLY_TRANSPORT_ERROR_PROTOCOL_VIOLATION;
    }

    if ((ret = quicly_local_cid_retire(&conn->super.local.cid_set, frame.sequence, &has_pending)) != 0)
        return ret;
    if (has_pending)
        conn->egress.pending_flows |= QUICLY_PENDING_FLOW_CID_FRAME_BIT;

    return 0;
}